

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::SetTor(CNetAddr *this,string *addr)

{
  torv3 *last;
  ulong uVar1;
  undefined8 first;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  string_view str;
  Span<const_unsigned_char> addr_pubkey;
  uint8_t calculated_checksum [2];
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> input;
  short local_4a;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (6 < addr->_M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,addr,
               addr->_M_string_length - 6,0xffffffffffffffff);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,".onion");
    if ((torv3 *)local_48._0_8_ != (torv3 *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_38._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      uVar1 = addr->_M_string_length;
      uVar3 = uVar1 - 6;
      if (uVar1 < uVar1 - 6) {
        uVar3 = uVar1;
      }
      str._M_str = (addr->_M_dataplus)._M_p;
      str._M_len = uVar3;
      DecodeBase32((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)local_48
                   ,str);
      first = local_48._0_8_;
      if (((local_38._M_local_buf[8] == 1) && (local_48._8_8_ - local_48._0_8_ == 0x23)) &&
         (*(torv3 *)(local_48._0_8_ + 0x22) == (torv3)0x3)) {
        addr_pubkey.m_size = (size_t)&local_4a;
        addr_pubkey.m_data = (uchar *)0x20;
        torv3::Checksum((torv3 *)local_48._0_8_,addr_pubkey,(uint8_t (*) [2])0x23);
        last = (torv3 *)(first + 0x20);
        bVar4 = *(short *)last == local_4a;
        if (bVar4) {
          this->m_net = NET_ONION;
          prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
                    (&this->m_addr,(uchar *)first,(uchar *)last);
        }
      }
      else {
        bVar4 = false;
      }
      if (((local_38._M_local_buf[8] & 1U) != 0) &&
         (local_38._M_local_buf[8] = 0, (torv3 *)local_48._0_8_ != (torv3 *)0x0)) {
        operator_delete((void *)local_48._0_8_,local_38._M_allocated_capacity - local_48._0_8_);
      }
      goto LAB_006bf227;
    }
  }
  bVar4 = false;
LAB_006bf227:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::SetTor(const std::string& addr)
{
    static const char* suffix{".onion"};
    static constexpr size_t suffix_len{6};

    if (addr.size() <= suffix_len || addr.substr(addr.size() - suffix_len) != suffix) {
        return false;
    }

    auto input = DecodeBase32(std::string_view{addr}.substr(0, addr.size() - suffix_len));

    if (!input) {
        return false;
    }

    if (input->size() == torv3::TOTAL_LEN) {
        Span<const uint8_t> input_pubkey{input->data(), ADDR_TORV3_SIZE};
        Span<const uint8_t> input_checksum{input->data() + ADDR_TORV3_SIZE, torv3::CHECKSUM_LEN};
        Span<const uint8_t> input_version{input->data() + ADDR_TORV3_SIZE + torv3::CHECKSUM_LEN, sizeof(torv3::VERSION)};

        if (!std::ranges::equal(input_version, torv3::VERSION)) {
            return false;
        }

        uint8_t calculated_checksum[torv3::CHECKSUM_LEN];
        torv3::Checksum(input_pubkey, calculated_checksum);

        if (!std::ranges::equal(input_checksum, calculated_checksum)) {
            return false;
        }

        m_net = NET_ONION;
        m_addr.assign(input_pubkey.begin(), input_pubkey.end());
        return true;
    }

    return false;
}